

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FadeEffect_test.cpp
# Opt level: O3

void __thiscall fade_effect_converge_Test::TestBody(fade_effect_converge_Test *this)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  char *message;
  long lVar4;
  float fVar5;
  AssertionResult gtest_ar;
  ConvergeExpecation ces [6];
  Message local_98;
  internal local_90 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  AssertHelper local_80;
  byte local_78 [4];
  float local_74;
  uchar local_70 [4];
  undefined2 local_6c;
  undefined4 local_68;
  undefined1 local_64;
  undefined2 local_60;
  undefined4 local_5c;
  undefined1 local_58;
  undefined2 local_54;
  undefined4 local_50;
  undefined1 local_4c;
  undefined2 local_48;
  undefined4 local_44;
  undefined1 local_40;
  undefined2 local_3c;
  undefined4 local_38;
  undefined1 local_34;
  
  local_78[0] = 0x50;
  local_78[1] = 0x5a;
  local_74 = 0.5;
  local_70[0] = 'U';
  local_6c = 0xff00;
  local_68 = 0x3f000000;
  local_64 = 0x7f;
  local_60 = 0x1432;
  local_5c = 0x3e99999a;
  local_58 = 0x29;
  local_54 = 0x1020;
  local_50 = 0x3f000000;
  local_4c = 0x18;
  local_48 = 0x30;
  local_44 = 0x3f000000;
  local_40 = 0x18;
  local_3c = 0xe0ff;
  local_38 = 0x3f000000;
  local_34 = 0xef;
  lVar4 = 0;
  do {
    bVar1 = local_78[lVar4];
    fVar5 = (float)bVar1;
    bVar2 = local_78[lVar4 + 1];
    if (bVar2 < bVar1) {
      fVar5 = fVar5 - *(float *)(local_70 + lVar4 + -4) * (float)(int)((uint)bVar1 - (uint)bVar2);
    }
    else {
      fVar5 = *(float *)(local_70 + lVar4 + -4) * (float)(int)((uint)bVar2 - (uint)bVar1) + fVar5;
    }
    local_98.ss_.ptr_._0_1_ = (undefined1)(int)fVar5;
    testing::internal::CmpHelperEQ<unsigned_char,unsigned_char>
              (local_90,
               "(color_t)(ces[i].y >= ces[i].x ? ces[i].x + ces[i].ratio * (ces[i].y - ces[i].x) : ces[i].x - ces[i].ratio * (ces[i].x - ces[i].y) )"
               ,"ces[i].result",(uchar *)&local_98,local_70 + lVar4);
    if (local_90[0] == (internal)0x0) {
      testing::Message::Message(&local_98);
      message = "";
      if (local_88.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        message = ((local_88.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_80,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/kigster[P]librgb/test/src/FadeEffect_test.cpp"
                 ,0x2c,message);
      testing::internal::AssertHelper::operator=(&local_80,&local_98);
      testing::internal::AssertHelper::~AssertHelper(&local_80);
      if (CONCAT71(local_98.ss_.ptr_._1_7_,local_98.ss_.ptr_._0_1_) != 0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) &&
           ((long *)CONCAT71(local_98.ss_.ptr_._1_7_,local_98.ss_.ptr_._0_1_) != (long *)0x0)) {
          (**(code **)(*(long *)CONCAT71(local_98.ss_.ptr_._1_7_,local_98.ss_.ptr_._0_1_) + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_88,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    lVar4 = lVar4 + 0xc;
  } while (lVar4 != 0x48);
  return;
}

Assistant:

TEST(fade_effect, converge) {
    float r = 0.5;
    ConvergeExpecation ces[] = {
            {80,   90,   0.5, 85},
            {0,    255,  0.5, 127},
            {50,   20,   0.3, 41},
            {0x20, 0x10, r,   (color_t) (0x20 - r * (0x20 - 0x10))},
            {0x30, 0x00, r,   (color_t) (0x30 - r * (0x30 - 0x00))},
            {0xFF, 0xE0, r,   (color_t) (0xFF - r * (0xFF - 0xE0))},
    };

    for (int i = 0; i < sizeof(ces) / sizeof(ConvergeExpecation); i++) {
        EXPECT_CONVERGENCE(ces[i]);
    }
}